

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O3

DWORD GetFullPathNameW(LPCWSTR lpFileName,DWORD nBufferLength,LPWSTR lpBuffer,LPWSTR *lpFilePart)

{
  long lVar1;
  LPSTR lpWideCharStr;
  undefined8 lpBuffer_00;
  int iVar2;
  DWORD DVar3;
  ulong uVar4;
  CHAR *pCVar5;
  CHAR *pCVar6;
  DWORD DVar7;
  long in_FS_OFFSET;
  undefined8 uStackY_b0;
  CHAR aCStack_98 [8];
  int local_90 [2];
  LPSTR lpFilePartA;
  LPWSTR *local_80;
  undefined1 local_78 [8];
  PathCharString bufferAPS;
  
  bufferAPS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  bufferAPS._32_8_ = local_78;
  bufferAPS.m_size = 0;
  pCVar6 = aCStack_98;
  lpFilePartA = (LPSTR)lpBuffer;
  local_80 = lpFilePart;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002c1d49;
  uStackY_b0 = 0x2c1b46;
  iVar2 = WideCharToMultiByte(0,0,lpFileName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  pCVar5 = aCStack_98;
  if (iVar2 == 0) {
    DVar7 = 0x57;
LAB_002c1c90:
    *(undefined8 *)(pCVar5 + -8) = 0x2c1c95;
    SetLastError(DVar7);
LAB_002c1ce0:
    DVar3 = 0;
  }
  else {
    lVar1 = -((long)iVar2 + 0xfU & 0xfffffffffffffff0);
    *(undefined8 *)(&stack0xffffffffffffff58 + lVar1) = 0;
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0;
    *(undefined8 *)((long)&uStackY_b0 + lVar1) = 0x2c1b88;
    iVar2 = WideCharToMultiByte(0,0,lpFileName,-1,aCStack_98 + lVar1,iVar2,
                                *(LPCSTR *)(&stack0xffffffffffffff58 + lVar1),
                                *(LPBOOL *)(&stack0xffffffffffffff60 + lVar1));
    pCVar6 = aCStack_98 + lVar1;
    pCVar5 = aCStack_98 + lVar1;
    if (iVar2 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1c73;
      DVar7 = GetLastError();
      if (DVar7 == 0x7a) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c1d49;
      }
      else {
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1cc3;
        fprintf(_stderr,"] %s %s:%d","GetFullPathNameW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                ,0xf6);
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1cd6;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar7);
      }
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1ce0;
      SetLastError(0x57);
      goto LAB_002c1ce0;
    }
    DVar7 = MaxWCharToAcpLengthRatio << 10;
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1bb1;
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_78,(long)(int)DVar7);
    lpBuffer_00 = bufferAPS._32_8_;
    if (bufferAPS._32_8_ == 0) {
      DVar7 = 8;
      pCVar5 = aCStack_98 + lVar1;
      goto LAB_002c1c90;
    }
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1bd3;
    DVar3 = GetFullPathNameA(aCStack_98 + lVar1,DVar7,(LPSTR)lpBuffer_00,(LPSTR *)local_90);
    lpWideCharStr = lpFilePartA;
    uVar4 = (ulong)DVar3;
    if (uVar4 < bufferAPS.m_size) {
      bufferAPS.m_size = uVar4;
    }
    *(undefined1 *)(bufferAPS._32_8_ + bufferAPS.m_size) = 0;
    pCVar5 = aCStack_98 + lVar1;
    if (uVar4 <= (ulong)(long)(int)DVar7 && DVar3 != 0) {
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1c1c;
      iVar2 = MultiByteToWideChar(0,0,(LPCSTR)lpBuffer_00,-1,(LPWSTR)lpWideCharStr,nBufferLength);
      if (iVar2 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1d1e;
        DVar7 = GetLastError();
        pCVar5 = aCStack_98 + lVar1;
        if (DVar7 != 0x7a) goto LAB_002c1ce0;
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1d3a;
        DVar3 = MultiByteToWideChar(0,0,(LPCSTR)lpBuffer_00,-1,(LPWSTR)0x0,0);
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1d47;
        SetLastError(0x6f);
        pCVar5 = aCStack_98 + lVar1;
      }
      else {
        DVar3 = iVar2 - 1;
        pCVar5 = aCStack_98 + lVar1;
        if (local_80 != (LPWSTR *)0x0) {
          *local_80 = (LPWSTR)lpFilePartA;
          *(undefined8 *)(&stack0xffffffffffffff60 + lVar1) = 0x2c1c59;
          iVar2 = MultiByteToWideChar(0,0,(LPCSTR)lpBuffer_00,local_90[0] - (int)lpBuffer_00,
                                      (LPWSTR)0x0,0);
          *local_80 = *local_80 + iVar2;
          pCVar5 = aCStack_98 + lVar1;
        }
      }
    }
  }
  pCVar6 = pCVar5;
  if (PAL_InitializeChakraCoreCalled != false) {
    *(undefined8 *)(pCVar5 + -8) = 0x2c1cf8;
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_78);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != bufferAPS.m_count) {
      *(code **)(pCVar5 + -8) = GetLongPathNameW;
      __stack_chk_fail();
    }
    return DVar3;
  }
LAB_002c1d49:
  *(undefined1 **)(pCVar6 + -8) = &LAB_002c1d4e;
  abort();
}

Assistant:

DWORD
PALAPI
GetFullPathNameW(
     IN LPCWSTR lpFileName,
     IN DWORD nBufferLength,
     OUT LPWSTR lpBuffer,
     OUT LPWSTR *lpFilePart)
{
    LPSTR fileNameA;
    /* bufferA needs to be able to hold a path that's potentially as
       large as MAX_LONGPATH WCHARs. */
    CHAR * bufferA;
    size_t bufferASize = 0;
    PathCharString bufferAPS;
    LPSTR lpFilePartA;
    int   fileNameLength;
    int   srcSize;
    DWORD length;
    DWORD nRet = 0;

    PERF_ENTRY(GetFullPathNameW);
    ENTRY("GetFullPathNameW(lpFileName=%p (%S), nBufferLength=%u, lpBuffer=%p"
          ", lpFilePart=%p)\n",
          lpFileName?lpFileName:W16_NULLSTRING,
          lpFileName?lpFileName:W16_NULLSTRING, nBufferLength,
          lpBuffer, lpFilePart);

    /* Find the number of bytes required to convert lpFileName
       to ANSI. This may be more than MAX_LONGPATH. We try to
       handle that case, since it may be less than MAX_LONGPATH
       WCHARs. */

    fileNameLength = WideCharToMultiByte(CP_ACP, 0, lpFileName,
                                         -1, NULL, 0, NULL, NULL);
    if (fileNameLength == 0)
    {
        /* Couldn't convert to ANSI. That's odd. */
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    else
    {
        fileNameA = static_cast<LPSTR>(alloca(fileNameLength));
    }

    /* Now convert lpFileName to ANSI. */
    srcSize = WideCharToMultiByte (CP_ACP, 0, lpFileName,
                                   -1, fileNameA, fileNameLength,
                                   NULL, NULL );
    if( srcSize == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            ERROR("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
        }
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    bufferASize = MAX_LONGPATH * MaxWCharToAcpLengthRatio;
    bufferA = bufferAPS.OpenStringBuffer(bufferASize);
    if (NULL == bufferA)
    {
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    length = GetFullPathNameA(fileNameA, bufferASize, bufferA, &lpFilePartA);
    bufferAPS.CloseBuffer(length);

    if (length == 0 || length > bufferASize)
    {
        /* Last error is set by GetFullPathNameA */
        nRet = length;
        goto done;
    }

    /* Convert back to Unicode the result */
    nRet = MultiByteToWideChar( CP_ACP, 0, bufferA, -1,
                                lpBuffer, nBufferLength );

    if (nRet == 0)
    {
        if ( GetLastError() == ERROR_INSUFFICIENT_BUFFER )
        {
            /* get the required length */
            nRet = MultiByteToWideChar( CP_ACP, 0, bufferA, -1,
                                        NULL, 0 );
            SetLastError(ERROR_BUFFER_OVERFLOW);
        }

        goto done;
    }

    /* MultiByteToWideChar counts the trailing NULL, but
       GetFullPathName does not. */
    nRet--;

    /* now set lpFilePart */
    if (lpFilePart != NULL)
    {
        *lpFilePart = lpBuffer;
        *lpFilePart += MultiByteToWideChar( CP_ACP, 0, bufferA,
                                            lpFilePartA - bufferA, NULL, 0);
    }

done:
    LOGEXIT("GetFullPathNameW returns DWORD %u\n", nRet);
    PERF_EXIT(GetFullPathNameW);
    return nRet;
}